

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# on_off_sketch.h
# Opt level: O0

void __thiscall OO_FPI<8U>::~OO_FPI(OO_FPI<8U> *this)

{
  void *in_RDI;
  
  ~OO_FPI(this);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

~OO_FPI() {
		delete[] buckets;
		delete[] sketch;
		delete bucketBitsets;
		delete sketchBitsets;
	}